

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O2

void __thiscall libwebm::TempFileDeleter::~TempFileDeleter(TempFileDeleter *this)

{
  ifstream file;
  int aiStack_1f0 [122];
  
  std::ifstream::ifstream(&file,(this->file_name_)._M_dataplus._M_p,_S_in);
  if (*(int *)((long)aiStack_1f0 + *(long *)(_file + -0x18)) == 0) {
    std::ifstream::close();
    remove((this->file_name_)._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(&file);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TempFileDeleter::~TempFileDeleter() {
  std::ifstream file(file_name_.c_str());
  if (file.good()) {
    file.close();
    std::remove(file_name_.c_str());
  }
}